

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  bool *pbVar1;
  char *__s;
  Offset OVar2;
  Module *this_00;
  uint64_t uVar3;
  size_t sVar4;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_38;
  
  __s = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar4 = strlen(__s);
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>.
  super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>)
       operator_new(0x80);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                  .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                  .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x18) = sVar4;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                   .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x20) =
       __s;
  *(Offset *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x28) = OVar2;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x38) = 5;
  *(undefined ***)
   local_38._M_t.
   super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>.
   super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl =
       &PTR__TableModuleField_001a12b8;
  *(long **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                   .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_38._M_t.
                      super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                      .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x50);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                  .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x50) = 0;
  uVar3 = elem_limits->max;
  *(uint64_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x60) =
       elem_limits->initial;
  *(uint64_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x68) = uVar3;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x6f) =
       *(undefined4 *)((long)&elem_limits->max + 7);
  *(Type *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                  .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 0x78) =
       elem_type;
  this_00 = this->module_;
  pbVar1 = &(this_00->features_used).exceptions;
  *pbVar1 = (bool)(*pbVar1 | elem_type.enum_ == ExnRef);
  Module::AppendField(this_00,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                               *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
      .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl !=
      (TableModuleField *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                          .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = std::make_unique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  table.elem_type = elem_type;
  module_->features_used.exceptions |= (elem_type == Type::ExnRef);
  module_->AppendField(std::move(field));
  return Result::Ok;
}